

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O2

uo_cb * uo_cb_clone(uo_cb *cb)

{
  uo_cb *cb_00;
  uo_linklist *puVar1;
  
  cb_00 = uo_cb_create();
  uo_stack_push_arr(&cb_00->stack,(cb->stack).items,(cb->stack).count);
  puVar1 = &cb->funclist;
  while (puVar1 = puVar1->next, puVar1 != &cb->funclist) {
    uo_cb_append_func(cb_00,(uo_cb_func)puVar1[1].next);
  }
  return cb_00;
}

Assistant:

uo_cb *uo_cb_clone(
    const uo_cb *cb)
{
    uo_cb *cb_clone = uo_cb_create();
    uo_stack_push_arr(&cb_clone->stack, cb->stack.items, cb->stack.count);

    uo_linklist *link = cb->funclist.next;

    while (link != &cb->funclist)
    {
        uo_cb_append_func(cb_clone, ((uo_cb_func_linklist *)link)->item);
        link = link->next;
    }

    return cb_clone;
}